

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O1

bool bssl::ssl_check_message_type(SSL *ssl,SSLMessage *msg,int type)

{
  byte bVar1;
  
  bVar1 = msg->type;
  if ((uint)bVar1 != type) {
    ssl_send_alert(ssl,2,10);
    ERR_put_error(0x10,0,0xdf,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                  ,0x73);
    ERR_add_error_dataf("got type %d, wanted type %d",(ulong)msg->type,(ulong)(uint)type);
  }
  return (uint)bVar1 == type;
}

Assistant:

bool ssl_check_message_type(SSL *ssl, const SSLMessage &msg, int type) {
  if (msg.type != type) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_UNEXPECTED_MESSAGE);
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_MESSAGE);
    ERR_add_error_dataf("got type %d, wanted type %d", msg.type, type);
    return false;
  }

  return true;
}